

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

Lf_Cut_t * Lf_MemLoadCut(Lf_Mem_t *p,int iCur,int iObj,Lf_Cut_t *pCut,int fTruth,int fRecycle)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  void **ppvVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  byte *pbVar13;
  byte *pbVar14;
  int iVar15;
  uint uVar16;
  
  bVar4 = (byte)p->LogPage & 0x1f;
  uVar16 = (uint)iCur >> bVar4;
  if ((p->vPages).nSize <= (int)uVar16) {
    __assert_fail("Page < Vec_PtrSize(&p->vPages)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x228,"Lf_Cut_t *Lf_MemLoadCut(Lf_Mem_t *, int, int, Lf_Cut_t *, int, int)");
  }
  if ((int)((uint)iCur >> bVar4) < 0) {
LAB_0075e210:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pbVar13 = (byte *)((ulong)(uint)(iCur & p->MaskPage) + (long)(p->vPages).pArray[uVar16]);
  pbVar14 = pbVar13 + 1;
  bVar8 = *pbVar13;
  uVar11 = (uint)bVar8;
  bVar7 = 0;
  if ((char)bVar8 < '\0') {
    bVar7 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 | (uVar11 & 0x7f) << (bVar7 & 0x1f);
      bVar8 = *pbVar14;
      uVar11 = (uint)bVar8;
      pbVar14 = pbVar14 + 1;
      bVar7 = bVar7 + 7;
    } while ((char)bVar8 < '\0');
  }
  else {
    uVar5 = 0;
  }
  uVar5 = uVar11 << (bVar7 & 0x1f) | uVar5;
  pCut->field_0x17 = (char)uVar5;
  if (0xd < (uVar5 & 0xff)) {
    __assert_fail("pCut->nLeaves <= LF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x22b,"Lf_Cut_t *Lf_MemLoadCut(Lf_Mem_t *, int, int, Lf_Cut_t *, int, int)");
  }
  if ((uVar5 & 0xff) != 0) {
    uVar9 = (ulong)(uVar5 & 0xff);
    do {
      bVar8 = *pbVar14;
      uVar11 = (uint)bVar8;
      pbVar14 = pbVar14 + 1;
      bVar7 = 0;
      if ((char)bVar8 < '\0') {
        bVar7 = 0;
        uVar10 = 0;
        do {
          uVar10 = uVar10 | (uVar11 & 0x7f) << (bVar7 & 0x1f);
          bVar8 = *pbVar14;
          uVar11 = (uint)bVar8;
          pbVar14 = pbVar14 + 1;
          bVar7 = bVar7 + 7;
        } while ((char)bVar8 < '\0');
      }
      else {
        uVar10 = 0;
      }
      iObj = iObj - (uVar11 << (bVar7 & 0x1f) | uVar10);
      *(int *)(&pCut->field_0x14 + uVar9 * 4) = iObj;
      bVar3 = 1 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar3);
  }
  if (fTruth == 0) {
    uVar11 = 0xffffffff;
  }
  else {
    uVar10 = (uint)*pbVar14;
    bVar8 = 0;
    if ((char)*pbVar14 < '\0') {
      bVar8 = 0;
      uVar11 = 0;
      do {
        pbVar14 = pbVar14 + 1;
        uVar11 = uVar11 | (uVar10 & 0x7f) << (bVar8 & 0x1f);
        uVar10 = (uint)*pbVar14;
        bVar8 = bVar8 + 7;
      } while ((char)*pbVar14 < '\0');
    }
    else {
      uVar11 = 0;
    }
    uVar11 = uVar10 << (bVar8 & 0x1f) | uVar11;
  }
  pCut->iFunc = uVar11;
  if ((uVar5 << 0x18 < 0x2000000) && (3 < (int)uVar11)) {
    __assert_fail("pCut->nLeaves >= 2 || pCut->iFunc <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x22f,"Lf_Cut_t *Lf_MemLoadCut(Lf_Mem_t *, int, int, Lf_Cut_t *, int, int)");
  }
  if ((uint)iCur >> bVar4 == 0 || fRecycle == 0) goto LAB_0075e1cb;
  if ((p->vPages).nSize < (int)uVar16) goto LAB_0075e210;
  pvVar1 = (p->vPages).pArray[uVar16 - 1];
  if (pvVar1 == (void *)0x0) goto LAB_0075e1cb;
  pVVar2 = p->vFree;
  uVar11 = pVVar2->nCap;
  if (pVVar2->nSize == uVar11) {
    if ((int)uVar11 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar6;
      iVar15 = 0x10;
    }
    else {
      iVar15 = uVar11 * 2;
      if (iVar15 <= (int)uVar11) goto LAB_0075e19e;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar11 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar11 << 4);
      }
      pVVar2->pArray = ppvVar6;
    }
    pVVar2->nCap = iVar15;
  }
LAB_0075e19e:
  iVar15 = pVVar2->nSize;
  pVVar2->nSize = iVar15 + 1;
  pVVar2->pArray[iVar15] = pvVar1;
  if ((p->vPages).nSize < (int)uVar16) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
  (p->vPages).pArray[uVar16 - 1] = (void *)0x0;
LAB_0075e1cb:
  if ((fRecycle == 0) || (*(uint *)&pCut->field_0x14 < 0x1000000)) {
    uVar9 = 0;
  }
  else {
    uVar12 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 | 1L << ((ulong)*(byte *)((long)&pCut[1].Sign + uVar12 * 4) & 0x3f);
      uVar12 = uVar12 + 1;
    } while (*(uint *)&pCut->field_0x14 >> 0x18 != uVar12);
  }
  pCut->Sign = uVar9;
  pCut->field_0x16 = pCut->field_0x16 & 0x7f;
  return pCut;
}

Assistant:

static inline Lf_Cut_t * Lf_MemLoadCut( Lf_Mem_t * p, int iCur, int iObj, Lf_Cut_t * pCut, int fTruth, int fRecycle )
{
    unsigned char * pPlace;  
    int i, Prev = iObj, Page = iCur >> p->LogPage;
    assert( Page < Vec_PtrSize(&p->vPages) );
    pPlace = (unsigned char *)Vec_PtrEntry(&p->vPages, Page) + (iCur & p->MaskPage);
    pCut->nLeaves = Gia_AigerReadUnsigned(&pPlace);
    assert( pCut->nLeaves <= LF_LEAF_MAX );
    for ( i = pCut->nLeaves - 1; i >= 0; i-- )
        pCut->pLeaves[i] = Prev - Gia_AigerReadUnsigned(&pPlace), Prev = pCut->pLeaves[i];
    pCut->iFunc = fTruth ? Gia_AigerReadUnsigned(&pPlace) : -1;
    assert( pCut->nLeaves >= 2 || pCut->iFunc <= 3 );
    if ( fRecycle && Page && Vec_PtrEntry(&p->vPages, Page-1) )
    {
        Vec_PtrPush( p->vFree, Vec_PtrEntry(&p->vPages, Page-1) );
        Vec_PtrWriteEntry( &p->vPages, Page-1, NULL );
    }
    pCut->Sign = fRecycle ? Lf_CutGetSign(pCut) : 0;
    pCut->fMux7 = 0;
    return pCut;
}